

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# njd_set_digit.c
# Opt level: O2

int search_numerative_class(char **list,NJDNode *node)

{
  int iVar1;
  char *__s2;
  int iVar2;
  
  __s2 = NJDNode_get_string(node);
  if ((*__s2 == '*') && (__s2[1] == '\0')) {
LAB_00140c79:
    iVar2 = 0;
  }
  else {
    iVar2 = 1;
    do {
      if (*list == (char *)0x0) goto LAB_00140c79;
      iVar1 = strcmp(*list,__s2);
      list = list + 1;
    } while (iVar1 != 0);
  }
  return iVar2;
}

Assistant:

static int search_numerative_class(const char *list[], NJDNode * node)
{
   int i;
   const char *str = NJDNode_get_string(node);

   if (strcmp(str, "*") == 0)
      return 0;
   for (i = 0; list[i] != NULL; i++) {
      if (strcmp(list[i], str) == 0)
         return 1;
   }
   return 0;
}